

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O0

cgltf_result cgltf_validate(cgltf_data *data)

{
  cgltf_accessor *pcVar1;
  int iVar2;
  cgltf_accessor *pcVar3;
  cgltf_size cVar4;
  cgltf_accessor_sparse *pcVar5;
  cgltf_size cVar6;
  cgltf_animation_channel *pcVar7;
  cgltf_size local_120;
  cgltf_node *local_110;
  cgltf_size values;
  cgltf_size components;
  cgltf_animation_channel *channel;
  cgltf_size j_2;
  cgltf_size i_6;
  cgltf_size j_1;
  cgltf_size i_5;
  cgltf_node *p2;
  cgltf_node *p1;
  cgltf_size i_4;
  cgltf_size i_3;
  cgltf_size index_bound_1;
  cgltf_accessor *indices;
  cgltf_size m;
  cgltf_size k_1;
  cgltf_size k;
  cgltf_accessor *first;
  cgltf_size j;
  cgltf_size i_2;
  cgltf_size req_size_1;
  cgltf_size i_1;
  cgltf_size index_bound;
  cgltf_size values_req_size;
  cgltf_size indices_req_size;
  cgltf_size indices_component_size;
  cgltf_accessor_sparse *sparse;
  cgltf_size req_size;
  cgltf_size element_size;
  cgltf_accessor *accessor;
  cgltf_size i;
  cgltf_data *data_local;
  
  for (accessor = (cgltf_accessor *)0x0; accessor < (cgltf_accessor *)data->accessors_count;
      accessor = (cgltf_accessor *)((long)&accessor->component_type + 1)) {
    pcVar3 = data->accessors + (long)accessor;
    cVar4 = cgltf_calc_size(pcVar3->type,pcVar3->component_type);
    if ((pcVar3->buffer_view != (cgltf_buffer_view *)0x0) &&
       (pcVar3->buffer_view->size < pcVar3->offset + pcVar3->stride * (pcVar3->count - 1) + cVar4))
    {
      return cgltf_result_data_too_short;
    }
    if (pcVar3->is_sparse != 0) {
      pcVar5 = &pcVar3->sparse;
      cVar6 = cgltf_calc_size(cgltf_type_scalar,(pcVar3->sparse).indices_component_type);
      if ((((pcVar3->sparse).indices_buffer_view)->size <
           (pcVar3->sparse).indices_byte_offset + cVar6 * pcVar5->count) ||
         (((pcVar3->sparse).values_buffer_view)->size <
          (pcVar3->sparse).values_byte_offset + cVar4 * pcVar5->count)) {
        return cgltf_result_data_too_short;
      }
      if ((((pcVar3->sparse).indices_component_type != cgltf_component_type_r_8u) &&
          ((pcVar3->sparse).indices_component_type != cgltf_component_type_r_16u)) &&
         ((pcVar3->sparse).indices_component_type != cgltf_component_type_r_32u)) {
        return cgltf_result_invalid_gltf;
      }
      if ((((pcVar3->sparse).indices_buffer_view)->buffer->data != (void *)0x0) &&
         (cVar4 = cgltf_calc_index_bound
                            ((pcVar3->sparse).indices_buffer_view,
                             (pcVar3->sparse).indices_byte_offset,
                             (pcVar3->sparse).indices_component_type,pcVar5->count),
         pcVar3->count <= cVar4)) {
        return cgltf_result_data_too_short;
      }
    }
  }
  for (req_size_1 = 0; req_size_1 < data->buffer_views_count; req_size_1 = req_size_1 + 1) {
    if ((data->buffer_views[req_size_1].buffer != (cgltf_buffer *)0x0) &&
       ((data->buffer_views[req_size_1].buffer)->size <
        data->buffer_views[req_size_1].offset + data->buffer_views[req_size_1].size)) {
      return cgltf_result_data_too_short;
    }
  }
  j = 0;
  while( true ) {
    if (data->meshes_count <= j) {
      for (i_4 = 0; i_4 < data->nodes_count; i_4 = i_4 + 1) {
        if (((data->nodes[i_4].weights != (cgltf_float *)0x0) &&
            (data->nodes[i_4].mesh != (cgltf_mesh *)0x0)) &&
           (((data->nodes[i_4].mesh)->primitives_count != 0 &&
            ((data->nodes[i_4].mesh)->primitives->targets_count != data->nodes[i_4].weights_count)))
           ) {
          return cgltf_result_invalid_gltf;
        }
      }
      for (p1 = (cgltf_node *)0x0; p1 < (cgltf_node *)data->nodes_count;
          p1 = (cgltf_node *)((long)&p1->name + 1)) {
        p2 = data->nodes[(long)p1].parent;
        if (p2 == (cgltf_node *)0x0) {
          local_110 = (cgltf_node *)0x0;
        }
        else {
          local_110 = p2->parent;
        }
        i_5 = (cgltf_size)local_110;
        while (p2 != (cgltf_node *)0x0 && i_5 != 0) {
          if (p2 == (cgltf_node *)i_5) {
            return cgltf_result_invalid_gltf;
          }
          p2 = p2->parent;
          if (*(long *)(i_5 + 8) == 0) {
            local_120 = 0;
          }
          else {
            local_120 = *(cgltf_size *)(*(long *)(i_5 + 8) + 8);
          }
          i_5 = local_120;
        }
      }
      for (j_1 = 0; j_1 < data->scenes_count; j_1 = j_1 + 1) {
        for (i_6 = 0; i_6 < data->scenes[j_1].nodes_count; i_6 = i_6 + 1) {
          if (data->scenes[j_1].nodes[i_6]->parent != (cgltf_node *)0x0) {
            return cgltf_result_invalid_gltf;
          }
        }
      }
      j_2 = 0;
      do {
        if (data->animations_count <= j_2) {
          return cgltf_result_success;
        }
        for (channel = (cgltf_animation_channel *)0x0;
            channel < (cgltf_animation_channel *)data->animations[j_2].channels_count;
            channel = (cgltf_animation_channel *)((long)&channel->sampler + 1)) {
          pcVar7 = data->animations[j_2].channels + (long)channel;
          if (pcVar7->target_node != (cgltf_node *)0x0) {
            values = 1;
            if (pcVar7->target_path == cgltf_animation_path_type_weights) {
              if ((pcVar7->target_node->mesh == (cgltf_mesh *)0x0) ||
                 (pcVar7->target_node->mesh->primitives_count == 0)) {
                return cgltf_result_invalid_gltf;
              }
              values = pcVar7->target_node->mesh->primitives->targets_count;
            }
            iVar2 = 1;
            if (pcVar7->sampler->interpolation == cgltf_interpolation_type_cubic_spline) {
              iVar2 = 3;
            }
            if (pcVar7->sampler->input->count * values * (long)iVar2 -
                pcVar7->sampler->output->count != 0) {
              return cgltf_result_data_too_short;
            }
          }
        }
        j_2 = j_2 + 1;
      } while( true );
    }
    if (((data->meshes[j].weights != (cgltf_float *)0x0) && (data->meshes[j].primitives_count != 0))
       && ((data->meshes[j].primitives)->targets_count != data->meshes[j].weights_count)) {
      return cgltf_result_invalid_gltf;
    }
    if (((data->meshes[j].target_names != (char **)0x0) && (data->meshes[j].primitives_count != 0))
       && ((data->meshes[j].primitives)->targets_count != data->meshes[j].target_names_count))
    break;
    for (first = (cgltf_accessor *)0x0; first < (cgltf_accessor *)data->meshes[j].primitives_count;
        first = (cgltf_accessor *)((long)&first->component_type + 1)) {
      if (data->meshes[j].primitives[(long)first].targets_count !=
          (data->meshes[j].primitives)->targets_count) {
        return cgltf_result_invalid_gltf;
      }
      if (data->meshes[j].primitives[(long)first].attributes_count != 0) {
        pcVar3 = (data->meshes[j].primitives[(long)first].attributes)->data;
        for (k_1 = 0; k_1 < data->meshes[j].primitives[(long)first].attributes_count; k_1 = k_1 + 1)
        {
          if ((data->meshes[j].primitives[(long)first].attributes[k_1].data)->count != pcVar3->count
             ) {
            return cgltf_result_invalid_gltf;
          }
        }
        for (m = 0; m < data->meshes[j].primitives[(long)first].targets_count; m = m + 1) {
          for (indices = (cgltf_accessor *)0x0;
              indices < (cgltf_accessor *)
                        data->meshes[j].primitives[(long)first].targets[m].attributes_count;
              indices = (cgltf_accessor *)((long)&indices->component_type + 1)) {
            if ((data->meshes[j].primitives[(long)first].targets[m].attributes[(long)indices].data)
                ->count != pcVar3->count) {
              return cgltf_result_invalid_gltf;
            }
          }
        }
        pcVar1 = data->meshes[j].primitives[(long)first].indices;
        if (((pcVar1 != (cgltf_accessor *)0x0) &&
            (pcVar1->component_type != cgltf_component_type_r_8u)) &&
           ((pcVar1->component_type != cgltf_component_type_r_16u &&
            (pcVar1->component_type != cgltf_component_type_r_32u)))) {
          return cgltf_result_invalid_gltf;
        }
        if ((((pcVar1 != (cgltf_accessor *)0x0) && (pcVar1->buffer_view != (cgltf_buffer_view *)0x0)
             ) && (pcVar1->buffer_view->buffer->data != (void *)0x0)) &&
           (cVar4 = cgltf_calc_index_bound
                              (pcVar1->buffer_view,pcVar1->offset,pcVar1->component_type,
                               pcVar1->count), pcVar3->count <= cVar4)) {
          return cgltf_result_data_too_short;
        }
      }
    }
    j = j + 1;
  }
  return cgltf_result_invalid_gltf;
}

Assistant:

cgltf_result cgltf_validate(cgltf_data* data)
{
    for (cgltf_size i = 0; i < data->accessors_count; ++i)
    {
        cgltf_accessor* accessor = &data->accessors[i];

        cgltf_size element_size = cgltf_calc_size(accessor->type, accessor->component_type);

        if (accessor->buffer_view)
        {
            cgltf_size req_size = accessor->offset + accessor->stride * (accessor->count - 1) + element_size;

            if (accessor->buffer_view->size < req_size)
            {
                return cgltf_result_data_too_short;
            }
        }

        if (accessor->is_sparse)
        {
            cgltf_accessor_sparse* sparse = &accessor->sparse;

            cgltf_size indices_component_size = cgltf_calc_size(cgltf_type_scalar, sparse->indices_component_type);
            cgltf_size indices_req_size = sparse->indices_byte_offset + indices_component_size * sparse->count;
            cgltf_size values_req_size = sparse->values_byte_offset + element_size * sparse->count;

            if (sparse->indices_buffer_view->size < indices_req_size ||
                sparse->values_buffer_view->size < values_req_size)
            {
                return cgltf_result_data_too_short;
            }

            if (sparse->indices_component_type != cgltf_component_type_r_8u &&
                sparse->indices_component_type != cgltf_component_type_r_16u &&
                sparse->indices_component_type != cgltf_component_type_r_32u)
            {
                return cgltf_result_invalid_gltf;
            }

            if (sparse->indices_buffer_view->buffer->data)
            {
                cgltf_size index_bound = cgltf_calc_index_bound(sparse->indices_buffer_view, sparse->indices_byte_offset, sparse->indices_component_type, sparse->count);

                if (index_bound >= accessor->count)
                {
                    return cgltf_result_data_too_short;
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->buffer_views_count; ++i)
    {
        cgltf_size req_size = data->buffer_views[i].offset + data->buffer_views[i].size;

        if (data->buffer_views[i].buffer && data->buffer_views[i].buffer->size < req_size)
        {
            return cgltf_result_data_too_short;
        }
    }

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        if (data->meshes[i].weights)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        if (data->meshes[i].target_names)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].target_names_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            if (data->meshes[i].primitives[j].targets_count != data->meshes[i].primitives[0].targets_count)
            {
                return cgltf_result_invalid_gltf;
            }

            if (data->meshes[i].primitives[j].attributes_count)
            {
                cgltf_accessor* first = data->meshes[i].primitives[j].attributes[0].data;

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
                {
                    if (data->meshes[i].primitives[j].attributes[k].data->count != first->count)
                    {
                        return cgltf_result_invalid_gltf;
                    }
                }

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
                {
                    for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                    {
                        if (data->meshes[i].primitives[j].targets[k].attributes[m].data->count != first->count)
                        {
                            return cgltf_result_invalid_gltf;
                        }
                    }
                }

                cgltf_accessor* indices = data->meshes[i].primitives[j].indices;

                if (indices &&
                    indices->component_type != cgltf_component_type_r_8u &&
                    indices->component_type != cgltf_component_type_r_16u &&
                    indices->component_type != cgltf_component_type_r_32u)
                {
                    return cgltf_result_invalid_gltf;
                }

                if (indices && indices->buffer_view && indices->buffer_view->buffer->data)
                {
                    cgltf_size index_bound = cgltf_calc_index_bound(indices->buffer_view, indices->offset, indices->component_type, indices->count);

                    if (index_bound >= first->count)
                    {
                        return cgltf_result_data_too_short;
                    }
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        if (data->nodes[i].weights && data->nodes[i].mesh)
        {
            if (data->nodes[i].mesh->primitives_count && data->nodes[i].mesh->primitives[0].targets_count != data->nodes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        cgltf_node* p1 = data->nodes[i].parent;
        cgltf_node* p2 = p1 ? p1->parent : NULL;

        while (p1 && p2)
        {
            if (p1 == p2)
            {
                return cgltf_result_invalid_gltf;
            }

            p1 = p1->parent;
            p2 = p2->parent ? p2->parent->parent : NULL;
        }
    }

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        for (cgltf_size j = 0; j < data->scenes[i].nodes_count; ++j)
        {
            if (data->scenes[i].nodes[j]->parent)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        for (cgltf_size j = 0; j < data->animations[i].channels_count; ++j)
        {
            cgltf_animation_channel* channel = &data->animations[i].channels[j];

            if (!channel->target_node)
            {
                continue;
            }

            cgltf_size components = 1;

            if (channel->target_path == cgltf_animation_path_type_weights)
            {
                if (!channel->target_node->mesh || !channel->target_node->mesh->primitives_count)
                {
                    return cgltf_result_invalid_gltf;
                }

                components = channel->target_node->mesh->primitives[0].targets_count;
            }

            cgltf_size values = channel->sampler->interpolation == cgltf_interpolation_type_cubic_spline ? 3 : 1;

            if (channel->sampler->input->count * components * values != channel->sampler->output->count)
            {
                return cgltf_result_data_too_short;
            }
        }
    }

    return cgltf_result_success;
}